

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void prf_messages_post_va(int type,int level,__va_list_tag *args)

{
  uint uVar1;
  uint *in_RDX;
  int in_ESI;
  int in_EDI;
  char *format;
  char string [256];
  int count;
  int i;
  bool_t present;
  undefined8 *local_148;
  char local_128 [268];
  int local_1c;
  int local_18;
  int local_14;
  uint *local_10;
  int local_8;
  int local_4;
  
  local_14 = 0;
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  local_1c = prf_array_count((void *)0x116640);
  for (local_18 = 0; local_18 < local_1c; local_18 = local_18 + 1) {
    if ((prf_handlers[local_4][local_18] != (prf_msg_handler_t *)0x0) &&
       (prf_handlers[local_4][local_18]->level <= local_8)) {
      local_14 = 1;
    }
  }
  if (local_14 != 0) {
    uVar1 = *local_10;
    if (uVar1 < 0x29) {
      local_148 = (undefined8 *)((long)(int)uVar1 + *(long *)(local_10 + 4));
      *local_10 = uVar1 + 8;
    }
    else {
      local_148 = *(undefined8 **)(local_10 + 2);
      *(undefined8 **)(local_10 + 2) = local_148 + 1;
    }
    vsprintf(local_128,(char *)*local_148,local_10);
    local_1c = prf_array_count((void *)0x116765);
    for (local_18 = 0; local_18 < local_1c; local_18 = local_18 + 1) {
      if ((prf_handlers[local_4][local_18] != (prf_msg_handler_t *)0x0) &&
         (prf_handlers[local_4][local_18]->level <= local_8)) {
        (*prf_handlers[local_4][local_18]->func)
                  (local_4,local_8,local_128,prf_handlers[local_4][local_18]->userdata);
      }
    }
  }
  return;
}

Assistant:

void
prf_messages_post_va(
    int type,
    int level,
    va_list args )
{
    bool_t present;
    int i, count;
    char string[ 256 ];
    assert( type > 0 && type < 6 );
    /* check that handler is present */
    present = FALSE;
    count = prf_array_count( prf_handlers[type] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[type][i] != NULL &&
             prf_handlers[type][i]->level <= level ) {
            present = TRUE;
        }
    }
    if ( present == FALSE ) {
        return;
    }
    /* build string */
    do {
        char * format;
        format = va_arg( args, char * );
        vsprintf( string, format, args );
    } while ( FALSE );

    /* call handlers with string */
    count = prf_array_count( prf_handlers[ type ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[type][i] != NULL &&
             prf_handlers[type][i]->level <= level ) {
            (*(prf_handlers[type][i]->func))( type, level, string,
                 prf_handlers[type][i]->userdata );
        }
    }
}